

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O3

int EC_POINT_cmp(EC_GROUP *group,EC_POINT *a,EC_POINT *b,BN_CTX *ctx)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *(long *)group;
  if (((*(code **)(lVar1 + 0xd8) != (code *)0x0) && (lVar1 == *(long *)a)) && (lVar1 == *(long *)b))
  {
    iVar2 = (**(code **)(lVar1 + 0xd8))();
    return iVar2;
  }
  return -1;
}

Assistant:

int EC_POINT_cmp(const EC_GROUP *group, const EC_POINT *a, const EC_POINT *b,
                 BN_CTX *ctx)
{
    if (group->meth->point_cmp == 0) {
        //ECerr(EC_F_EC_POINT_CMP, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return -1;
    }
    if ((group->meth != a->meth) || (a->meth != b->meth)) {
        //ECerr(EC_F_EC_POINT_CMP, EC_R_INCOMPATIBLE_OBJECTS);
        return -1;
    }
    return group->meth->point_cmp(group, a, b, ctx);
}